

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O2

void CMinit_local_formats(CManager cm)

{
  FILE *pFVar1;
  __pid_t _Var2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  FFSContext p_Var6;
  pthread_t pVar7;
  timespec ts;
  
  if (CMself_hosted_formats == 1) {
LAB_00127532:
    uVar5 = create_local_FMcontext(CMpbio_get_format_rep_callback,CMpbio_get_port_callback,cm);
    p_Var6 = (FFSContext)create_FFSContext_FM(uVar5);
    cm->FFScontext = p_Var6;
    iVar3 = CMtrace_val[6];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var2 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var2,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("\nUsing self-hosted PBIO formats\n",0x20,1,(FILE *)cm->CMTrace_file);
    }
    fflush((FILE *)cm->CMTrace_file);
    free_FMcontext(uVar5);
  }
  else {
    if (CMself_hosted_formats == -1) {
      CMself_hosted_formats = 1;
      pcVar4 = getenv("CMSelfFormats");
      if ((pcVar4 != (char *)0x0) || (pcVar4 = getenv("CMExternalFormats"), pcVar4 == (char *)0x0))
      goto LAB_00127532;
      CMself_hosted_formats = 0;
    }
    p_Var6 = (FFSContext)create_FFSContext_FM(0);
    cm->FFScontext = p_Var6;
    uVar5 = FMContext_from_FFS(p_Var6);
    FMcontext_allow_self_formats(uVar5);
    iVar3 = CMtrace_val[6];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,CMFormatVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var2 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var2,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("\nUsing external PBIO format server\n",0x23,1,(FILE *)cm->CMTrace_file);
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  uVar5 = FMContext_from_FFS(cm->FFScontext);
  iVar3 = FMcontext_get_format_server_identifier(uVar5);
  cm->FFSserver_identifier = iVar3;
  if (iVar3 == -1) {
    CMself_hosted_formats = 1;
  }
  return;
}

Assistant:

extern void
CMinit_local_formats(CManager cm)
{
    if (CMself_hosted_formats == -1) {
	CMself_hosted_formats = CM_SELF_FORMATS;  /* default set in CMake */
	if (getenv("CMSelfFormats") != NULL) {
	    CMself_hosted_formats = 1;
	} else if (getenv("CMExternalFormats") != NULL) {
	    CMself_hosted_formats = 0;
	}
    }
    if (CMself_hosted_formats == 1) {
	FMContext fmc = 
	    create_local_FMcontext(CMpbio_get_format_rep_callback, 
				   CMpbio_get_port_callback, cm);
	cm->FFScontext = create_FFSContext_FM(fmc);
	CMtrace_out(cm, CMFormatVerbose, 
		    "\nUsing self-hosted PBIO formats\n");
	free_FMcontext(fmc);  /* really just drop the ref count */
    } else {
	cm->FFScontext = create_FFSContext();
	FMcontext_allow_self_formats(FMContext_from_FFS(cm->FFScontext));
	CMtrace_out(cm, CMFormatVerbose, 
		    "\nUsing external PBIO format server\n");
    }
    cm->FFSserver_identifier = FMcontext_get_format_server_identifier(FMContext_from_FFS(cm->FFScontext));
    if (cm->FFSserver_identifier == -1) {
	CMself_hosted_formats = 1;
    }
//   handle these natively to avoid foreign handlers     
//    INT_CMregister_non_CM_message_handler(0x5042494f, CM_pbio_query);
//    INT_CMregister_non_CM_message_handler(0x4f494250, CM_pbio_query);
}